

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

handle pybind11::detail::
       tuple_caster<std::tuple,Eigen::Array<double,-1,1,0,-1,1>,Eigen::Array<double,-1,1,0,-1,1>,Eigen::Array<double,-1,-1,0,-1,-1>,Eigen::Array<double,-1,-1,0,-1,-1>>
       ::
       cast_impl<std::tuple<Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,_1,0,_1,_1>,Eigen::Array<double,_1,_1,0,_1,_1>>,0ul,1ul,2ul,3ul>
                 (tuple<Eigen::Array<double,__1,_1,_0,__1,_1>,_Eigen::Array<double,__1,_1,_0,__1,_1>,_Eigen::Array<double,__1,__1,_0,__1,__1>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
                  *src,return_value_policy policy,handle parent)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  __tuple_element_t<0UL,_tuple<Array<double,__1,_1,_0,__1,_1>,_Array<double,__1,_1,_0,__1,_1>,_Array<double,__1,__1,_0,__1,__1>,_Array<double,__1,__1,_0,__1,__1>_>_>
  *src_00;
  handle hVar4;
  __tuple_element_t<1UL,_tuple<Array<double,__1,_1,_0,__1,_1>,_Array<double,__1,_1,_0,__1,_1>,_Array<double,__1,__1,_0,__1,__1>,_Array<double,__1,__1,_0,__1,__1>_>_>
  *src_01;
  __tuple_element_t<2UL,_tuple<Array<double,__1,_1,_0,__1,_1>,_Array<double,__1,_1,_0,__1,_1>,_Array<double,__1,__1,_0,__1,__1>,_Array<double,__1,__1,_0,__1,__1>_>_>
  *src_02;
  __tuple_element_t<3UL,_tuple<Array<double,__1,_1,_0,__1,_1>,_Array<double,__1,_1,_0,__1,_1>,_Array<double,__1,__1,_0,__1,__1>,_Array<double,__1,__1,_0,__1,__1>_>_>
  *src_03;
  iterator pvVar5;
  PyObject **ppPVar6;
  handle local_108;
  iterator local_100;
  value_type *entry_1;
  iterator __end0_1;
  iterator __begin0_1;
  array<pybind11::object,_4UL> *__range3_1;
  int counter;
  tuple result;
  value_type *entry;
  iterator __end0;
  iterator __begin0;
  array<pybind11::object,_4UL> *__range3;
  undefined1 local_50 [8];
  array<pybind11::object,_4UL> entries;
  return_value_policy policy_local;
  tuple<Eigen::Array<double,__1,_1,_0,__1,_1>,_Eigen::Array<double,__1,_1,_0,__1,_1>,_Eigen::Array<double,__1,__1,_0,__1,__1>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>
  *src_local;
  handle parent_local;
  
  entries._M_elems[3].super_handle.m_ptr._7_1_ = policy;
  src_00 = std::
           get<0ul,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,_1,0,_1,_1>,Eigen::Array<double,_1,_1,0,_1,_1>>
                     (src);
  hVar4 = type_caster<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_void>::cast
                    (src_00,entries._M_elems[3].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)local_50,hVar4);
  src_01 = std::
           get<1ul,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,_1,0,_1,_1>,Eigen::Array<double,_1,_1,0,_1,_1>>
                     (src);
  hVar4 = type_caster<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_void>::cast
                    (src_01,entries._M_elems[3].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)&entries,hVar4);
  src_02 = std::
           get<2ul,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,_1,0,_1,_1>,Eigen::Array<double,_1,_1,0,_1,_1>>
                     (src);
  hVar4 = type_caster<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_void>::cast
                    (src_02,entries._M_elems[3].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)(entries._M_elems + 1),hVar4);
  src_03 = std::
           get<3ul,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,1,0,_1,1>,Eigen::Array<double,_1,_1,0,_1,_1>,Eigen::Array<double,_1,_1,0,_1,_1>>
                     (src);
  hVar4 = type_caster<Eigen::Array<double,_-1,_-1,_0,_-1,_-1>,_void>::cast
                    (src_03,entries._M_elems[3].super_handle.m_ptr._7_1_,parent);
  reinterpret_steal<pybind11::object>((pybind11 *)(entries._M_elems + 2),hVar4);
  __end0 = std::array<pybind11::object,_4UL>::begin((array<pybind11::object,_4UL> *)local_50);
  pvVar5 = std::array<pybind11::object,_4UL>::end((array<pybind11::object,_4UL> *)local_50);
  do {
    if (__end0 == pvVar5) {
      pybind11::tuple::tuple((tuple *)&stack0xffffffffffffff28,4);
      __range3_1._4_4_ = 0;
      __begin0_1 = (iterator)local_50;
      __end0_1 = std::array<pybind11::object,_4UL>::begin
                           ((array<pybind11::object,_4UL> *)__begin0_1);
      entry_1 = std::array<pybind11::object,_4UL>::end((array<pybind11::object,_4UL> *)__begin0_1);
      for (; __end0_1 != entry_1; __end0_1 = __end0_1 + 1) {
        local_100 = __end0_1;
        local_108 = object::release(__end0_1);
        ppPVar6 = pybind11::handle::ptr(&local_108);
        pPVar1 = (PyTypeObject *)*ppPVar6;
        ppPVar6 = pybind11::handle::ptr((handle *)&stack0xffffffffffffff28);
        iVar3 = PyType_HasFeature((*ppPVar6)->ob_type,0x4000000);
        if (iVar3 == 0) {
          __assert_fail("PyTuple_Check(result.ptr())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/usnistgov[P]isochoric/externals/pybind11/include/pybind11/cast.h"
                        ,0x584,
                        "static handle pybind11::detail::tuple_caster<std::tuple, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>::cast_impl(T &&, return_value_policy, handle, index_sequence<Is...>) [Tuple = std::tuple, Ts = <Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>, T = std::tuple<Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, 1>, Eigen::Array<double, -1, -1>, Eigen::Array<double, -1, -1>>, Is = <0UL, 1UL, 2UL, 3UL>]"
                       );
        }
        ppPVar6 = pybind11::handle::ptr((handle *)&stack0xffffffffffffff28);
        (&(*ppPVar6)[1].ob_type)[__range3_1._4_4_] = pPVar1;
        __range3_1._4_4_ = __range3_1._4_4_ + 1;
      }
      parent_local = object::release((object *)&stack0xffffffffffffff28);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      pybind11::tuple::~tuple((tuple *)&stack0xffffffffffffff28);
LAB_00174821:
      std::array<pybind11::object,_4UL>::~array((array<pybind11::object,_4UL> *)local_50);
      return (handle)parent_local.m_ptr;
    }
    bVar2 = pybind11::handle::operator_cast_to_bool(&__end0->super_handle);
    if (!bVar2) {
      memset(&parent_local,0,8);
      pybind11::handle::handle(&parent_local);
      result.super_object.super_handle.m_ptr._4_4_ = 1;
      goto LAB_00174821;
    }
    __end0 = __end0 + 1;
  } while( true );
}

Assistant:

static handle cast_impl(T &&src, return_value_policy policy, handle parent, index_sequence<Is...>) {
        std::array<object, size> entries{{
            reinterpret_steal<object>(make_caster<Ts>::cast(std::get<Is>(std::forward<T>(src)), policy, parent))...
        }};
        for (const auto &entry: entries)
            if (!entry)
                return handle();
        tuple result(size);
        int counter = 0;
        for (auto & entry: entries)
            PyTuple_SET_ITEM(result.ptr(), counter++, entry.release().ptr());
        return result.release();
    }